

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O1

void __thiscall
swrenderer::DrawFuzzColumnPalCommand::Execute(DrawFuzzColumnPalCommand *this,DrawerThread *thread)

{
  bool bVar1;
  BYTE *pBVar2;
  int iVar3;
  BYTE *pBVar4;
  int *piVar5;
  int core_skip;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  int pass_skip;
  uint uVar14;
  int iVar15;
  
  pBVar2 = NormalLight.Maps;
  uVar14 = *(uint *)&(this->super_DrawerCommand).field_0xc;
  uVar9 = 1;
  if (1 < (int)uVar14) {
    uVar9 = uVar14;
  }
  iVar13 = this->_fuzzviewheight;
  if (this->_yh < this->_fuzzviewheight) {
    iVar13 = this->_yh;
  }
  iVar3 = (iVar13 - uVar9) + 1;
  iVar13 = thread->pass_end_y - uVar9;
  if (iVar13 < 1) {
    iVar13 = 0;
  }
  if (iVar3 < iVar13) {
    iVar13 = iVar3;
  }
  uVar14 = thread->pass_start_y - uVar9;
  if ((int)uVar14 < 1) {
    uVar14 = 0;
  }
  iVar3 = thread->num_cores;
  lVar12 = (long)iVar3;
  iVar7 = (iVar3 - (int)((uVar14 + uVar9) - thread->core) % iVar3) % iVar3;
  iVar13 = (int)((~uVar14 + iVar3 + iVar13) - iVar7) / iVar3;
  if (0 < iVar13) {
    iVar7 = iVar7 + uVar14;
    pBVar4 = this->_destorg +
             (long)(this->_pitch * iVar7) + (long)this->_x + (long)(int)(&ylookup)[uVar9];
    iVar15 = (this->_fuzzpos + iVar7) % 0x32;
    lVar10 = (long)(this->_pitch * iVar3);
    if ((int)(iVar7 + uVar9) < iVar3) {
      *pBVar4 = NormalLight.Maps
                [(ulong)(pBVar4 + lVar10)[(int)(&fuzzoffset)[iVar15] * lVar12] + 0x600];
      iVar13 = iVar13 + -1;
      if (iVar13 == 0) {
        return;
      }
      iVar15 = (iVar15 + iVar3) % 0x32;
      pBVar4 = pBVar4 + lVar10;
    }
    iVar11 = (iVar3 + iVar13 + -1) * iVar3 + iVar7 + uVar9;
    iVar7 = this->_fuzzviewheight;
    iVar13 = iVar13 - (uint)(iVar7 < iVar11);
    if (0 < iVar13) {
      do {
        iVar6 = ((0x32 - iVar15) / iVar3 + 1) - (uint)((0x32 - iVar15) % iVar3 == 0);
        if (iVar13 < iVar6) {
          iVar6 = iVar13;
        }
        piVar5 = &fuzzoffset + iVar15;
        iVar8 = iVar6;
        do {
          *pBVar4 = pBVar2[(ulong)pBVar4[*piVar5 * lVar12] + 0x600];
          pBVar4 = pBVar4 + lVar10;
          piVar5 = piVar5 + lVar12;
          iVar15 = iVar15 + iVar3;
          iVar8 = iVar8 + -1;
        } while (iVar8 != 0);
        iVar15 = iVar15 % 0x32;
        iVar8 = iVar13 - iVar6;
        bVar1 = iVar6 <= iVar13;
        iVar13 = iVar8;
      } while (iVar8 != 0 && bVar1);
    }
    if (iVar7 < iVar11) {
      *pBVar4 = pBVar2[(ulong)pBVar4[(int)(&fuzzoffset)[iVar15] * lVar12 - lVar10] + 0x600];
    }
  }
  return;
}

Assistant:

void DrawFuzzColumnPalCommand::Execute(DrawerThread *thread)
	{
		int yl = MAX(_yl, 1);
		int yh = MIN(_yh, _fuzzviewheight);

		int count = thread->count_for_thread(yl, yh - yl + 1);

		// Zero length.
		if (count <= 0)
			return;

		uint8_t *map = &NormalLight.Maps[6 * 256];

		uint8_t *dest = thread->dest_for_thread(yl, _pitch, ylookup[yl] + _x + _destorg);

		int pitch = _pitch * thread->num_cores;
		int fuzzstep = thread->num_cores;
		int fuzz = (_fuzzpos + thread->skipped_by_thread(yl)) % FUZZTABLE;

		yl += thread->skipped_by_thread(yl);

		// Handle the case where we would go out of bounds at the top:
		if (yl < fuzzstep)
		{
			uint8_t *srcdest = dest + fuzzoffset[fuzz] * fuzzstep + pitch;
			//assert(static_cast<int>((srcdest - (uint8_t*)dc_destorg) / (_pitch)) < viewheight);

			*dest = map[*srcdest];
			dest += pitch;
			fuzz += fuzzstep;
			fuzz %= FUZZTABLE;

			count--;
			if (count == 0)
				return;
		}

		bool lowerbounds = (yl + (count + fuzzstep - 1) * fuzzstep > _fuzzviewheight);
		if (lowerbounds)
			count--;

		// Fuzz where fuzzoffset stays within bounds
		while (count > 0)
		{
			int available = (FUZZTABLE - fuzz);
			int next_wrap = available / fuzzstep;
			if (available % fuzzstep != 0)
				next_wrap++;

			int cnt = MIN(count, next_wrap);
			count -= cnt;
			do
			{
				uint8_t *srcdest = dest + fuzzoffset[fuzz] * fuzzstep;
				//assert(static_cast<int>((srcdest - (uint8_t*)dc_destorg) / (_pitch)) < viewheight);

				*dest = map[*srcdest];
				dest += pitch;
				fuzz += fuzzstep;
			} while (--cnt);

			fuzz %= FUZZTABLE;
		}

		// Handle the case where we would go out of bounds at the bottom
		if (lowerbounds)
		{
			uint8_t *srcdest = dest + fuzzoffset[fuzz] * fuzzstep - pitch;
			//assert(static_cast<int>((srcdest - (uint8_t*)dc_destorg) / (_pitch)) < viewheight);

			*dest = map[*srcdest];
		}
	}